

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall
Json::Path::Path(Path *this,string *path,PathArgument *a1,PathArgument *a2,PathArgument *a3,
                PathArgument *a4,PathArgument *a5)

{
  PathArgument *local_88;
  value_type local_80;
  PathArgument *local_78;
  PathArgument *local_70 [3];
  PathArgument *local_58;
  undefined1 local_50 [8];
  InArgs in;
  PathArgument *a4_local;
  PathArgument *a3_local;
  PathArgument *a2_local;
  PathArgument *a1_local;
  string *path_local;
  Path *this_local;
  
  in.super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)a4;
  std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::vector(&this->args_);
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::vector
            ((vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *)
             local_50);
  local_58 = a1;
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            ((vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *)
             local_50,&local_58);
  local_70[0] = a2;
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            ((vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *)
             local_50,local_70);
  local_78 = a3;
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            ((vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *)
             local_50,&local_78);
  local_80 = (value_type)
             in.
             super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            ((vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *)
             local_50,&local_80);
  local_88 = a5;
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            ((vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *)
             local_50,&local_88);
  makePath(this,path,(InArgs *)local_50);
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::~vector
            ((vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *)
             local_50);
  return;
}

Assistant:

Path::Path( const std::string &path,
            const PathArgument &a1,
            const PathArgument &a2,
            const PathArgument &a3,
            const PathArgument &a4,
            const PathArgument &a5 )
{
   InArgs in;
   in.push_back( &a1 );
   in.push_back( &a2 );
   in.push_back( &a3 );
   in.push_back( &a4 );
   in.push_back( &a5 );
   makePath( path, in );
}